

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

bool QtPrivate::QLessThanOperatorForType<QList<double>,_true>::lessThan
               (QMetaTypeInterface *param_1,void *a,void *b)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  
  pdVar1 = *(double **)((long)b + 8);
  uVar2 = *(ulong *)((long)b + 0x10);
  uVar3 = *(ulong *)((long)a + 0x10);
  if ((long)uVar2 < (long)*(ulong *)((long)a + 0x10)) {
    uVar3 = uVar2;
  }
  pdVar4 = pdVar1;
  if ((uVar3 & 0x1fffffffffffffff) != 0) {
    pdVar5 = *(double **)((long)a + 8);
    pdVar6 = pdVar5 + uVar3;
    do {
      if (*pdVar5 != *pdVar4) {
        return *pdVar5 < *pdVar4;
      }
      pdVar5 = pdVar5 + 1;
      pdVar4 = pdVar4 + 1;
    } while (pdVar5 != pdVar6);
  }
  return pdVar4 != pdVar1 + uVar2;
}

Assistant:

const T *constEnd() const noexcept { return data() + size; }